

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssembly.cpp
# Opt level: O1

Var Js::WebAssembly::EntryInstantiateStreaming(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  Var responseArg;
  JavascriptPromise *sourcePromise;
  BoundFunction *fulfillmentHandler;
  int in_stack_00000010;
  ArgumentReader local_88;
  JavascriptFunction *local_78;
  Var boundArgs [3];
  CallInfo local_58;
  CallInfo boundCallInfo;
  ArgumentReader myargs;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x7b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d97f5b;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  myargs.super_Arguments.Values = args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&myargs.super_Arguments.Values,
             (CallInfo *)&args.super_Arguments.Values);
  if (((ulong)myargs.super_Arguments.Values & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x7c,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar4) goto LAB_00d97f5b;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pJVar2 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x80,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00d97f5b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if (((ulong)myargs.super_Arguments.Values & 0xfffffe) == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e494,(PCWSTR)0x0);
  }
  pvVar6 = Arguments::operator[]((Arguments *)&myargs.super_Arguments.Values,0);
  responseArg = Arguments::operator[]((Arguments *)&myargs.super_Arguments.Values,1);
  sourcePromise = (JavascriptPromise *)TryResolveResponse(function,pvVar6,responseArg);
  if (sourcePromise != (JavascriptPromise *)0x0) {
    if (((uint)myargs.super_Arguments.Values & 0xffffff) < 3) {
      boundArgs[1] = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      boundArgs[1] = Arguments::operator[]((Arguments *)&myargs.super_Arguments.Values,2);
    }
    local_78 = (pJVar2->webAssemblyInstantiateBoundFunction).ptr;
    boundArgs[0] = Arguments::operator[]((Arguments *)&myargs.super_Arguments.Values,0);
    myargs.super_Arguments.Info = (Type)&local_78;
    local_58 = (CallInfo)0x2000003;
    boundCallInfo = (CallInfo)0x2000003;
    ArgumentReader::AdjustArguments((ArgumentReader *)&boundCallInfo,&local_58);
    local_88.super_Arguments.Info = boundCallInfo;
    local_88.super_Arguments.Values = (Type)myargs.super_Arguments.Info;
    fulfillmentHandler = BoundFunction::New(pSVar1,&local_88);
    pvVar6 = JavascriptPromise::CreateThenPromise
                       (sourcePromise,(RecyclableObject *)fulfillmentHandler,
                        (RecyclableObject *)(pJVar2->throwerFunction).ptr,pSVar1);
    return pvVar6;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e494,(PCWSTR)0x0);
}

Assistant:

Var WebAssembly::EntryInstantiateStreaming(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();

    Assert(!(callInfo.Flags & CallFlags_New));

    try
    {
        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedResponse);
        }

        // Check to see if it was a response object
        Var responsePromise = TryResolveResponse(function, args[0], args[1]);
        if (responsePromise)
        {
            Var importObject = scriptContext->GetLibrary()->GetUndefined();
            if (args.Info.Count >= 3)
            {
                importObject = args[2];
            }
            // Since instantiate takes extra arguments, we have to create a bound function to carry the importsObject until the response is resolved
            // Because function::bind() binds arguments from the left first, we have to calback a different function to reverse the order of the arguments
            Var boundArgs[] = { library->GetWebAssemblyInstantiateBoundFunction(), args[0], importObject };
            CallInfo boundCallInfo(CallFlags_Value, 3);
            ArgumentReader myargs(&boundCallInfo, boundArgs);
            RecyclableObject* boundFunction = BoundFunction::New(scriptContext, myargs);
            return JavascriptPromise::CreateThenPromise((JavascriptPromise*)responsePromise, boundFunction, library->GetThrowerFunction(), scriptContext);
        }
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedResponse);
    }
    catch (JavascriptException & e)
    {
        return JavascriptPromise::CreateRejectedPromise(e.GetAndClear()->GetThrownObject(scriptContext), scriptContext);
    }
}